

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Options::AddSwitch(Options *this,bool *var,char flag,string *long_flag,string *description,
                  bool default_val,string *group)

{
  mapped_type *this_00;
  anon_class_8_1_ba1d8287 local_d0;
  string local_c8;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  option op;
  bool default_val_local;
  string *description_local;
  string *long_flag_local;
  char flag_local;
  bool *var_local;
  Options *this_local;
  
  op._31_1_ = default_val;
  std::__cxx11::string::string((string *)&local_78,long_flag);
  std::__cxx11::string::string((string *)&local_98,description);
  std::__cxx11::string::string((string *)&local_c8,group);
  add_entry<bool&>(this,(option *)local_58,flag,&local_78,&local_98,&local_c8,false);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  op.name._0_4_ = 2;
  *var = (bool)(op._31_1_ & 1);
  local_d0.var = var;
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,(key_type *)&op.flag);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_d0);
  std::vector<option,_std::allocator<option>_>::push_back(&this->options,(value_type *)local_58);
  return;
}

Assistant:

inline void Options::AddSwitch(bool& var, char flag, std::string long_flag, std::string description, bool default_val, std::string group) {
    struct option op;
    this->add_entry<bool&>(op, flag, long_flag, description, group);

    op.has_arg = optional_argument;
    var = default_val;

    this->setters[op.val] = [&var](std::string) {
        var = !var;
    };

    this->options.push_back(op);
}